

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O1

DecodeStatus DecodeSide(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  byte bVar1;
  int iVar2;
  cs_detail *pcVar3;
  DecodeStatus DVar4;
  long lVar5;
  x86_reg xVar6;
  int iVar7;
  
  if ((Val == 1) && (bVar1 = Inst->size, bVar1 != 0)) {
    lVar5 = 0;
    do {
      if ((&Inst->Operands[0].Kind)[lVar5] == '\x01') {
        iVar2 = *(int *)((long)&Inst->Operands[0].field_2 + lVar5);
        iVar7 = 0x20;
        if ((iVar2 - 0x19U < 0x20) || (iVar7 = -0x20, iVar2 - 0x39U < 0x20)) {
          *(int *)((long)&Inst->Operands[0].field_2 + lVar5) = iVar2 + iVar7;
        }
      }
      lVar5 = lVar5 + 0x10;
    } while ((ulong)bVar1 * 0x10 != lVar5);
  }
  pcVar3 = Inst->flat_insn->detail;
  DVar4 = MCDisassembler_Success;
  if (pcVar3 != (cs_detail *)0x0) {
    DVar4 = MCDisassembler_Success;
    if (Val == 0) {
      xVar6 = X86_REG_AH;
    }
    else if (Val == 1) {
      xVar6 = X86_REG_AL;
    }
    else {
      xVar6 = X86_REG_INVALID;
      DVar4 = MCDisassembler_Fail;
    }
    (pcVar3->field_6).x86.operands[4].field_1.reg = xVar6;
  }
  return DVar4;
}

Assistant:

static DecodeStatus DecodeSide(MCInst *Inst, unsigned Val,
		uint64_t Address, void *Decoder)
{
	DecodeStatus ret = MCDisassembler_Success;
	MCOperand *op;
	int i;

	/* This is pretty messy, probably we should find a better way */
	if(Val == 1) {
		for(i = 0; i < Inst->size; i++) {
			op = &Inst->Operands[i];
			if(op->Kind == kRegister) {
				if((op->RegVal >= TMS320C64X_REG_A0) && (op->RegVal <= TMS320C64X_REG_A31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_A0 + TMS320C64X_REG_B0);
				else if((op->RegVal >= TMS320C64X_REG_B0) && (op->RegVal <= TMS320C64X_REG_B31))
					op->RegVal = (op->RegVal - TMS320C64X_REG_B0 + TMS320C64X_REG_A0);
			}
		}
	}

	if(!Inst->flat_insn->detail)
		return MCDisassembler_Success;

	switch(Val) {
		case 0:
			Inst->flat_insn->detail->tms320c64x.funit.side = 1;
			break;
		case 1:
			Inst->flat_insn->detail->tms320c64x.funit.side = 2;
			break;
		default:
			Inst->flat_insn->detail->tms320c64x.funit.side = 0;
			ret = MCDisassembler_Fail;
			break;
	}

	return ret;
}